

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_layer.cpp
# Opt level: O0

void __thiscall neural_networks::utilities::NeuralLayer::print(NeuralLayer *this)

{
  ostream *poVar1;
  NeuralLayer *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nData Vector: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->data);
  std::operator<<(poVar1,"\n\n");
  (*(this->data->super_Matrix<neural_networks::utilities::Neuron_*>)._vptr_Matrix[5])();
  if (this->bias != (Matrix<long_double> *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\nWeight Matrix: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->weights);
    std::operator<<(poVar1,"\n\n");
    (*this->weights->_vptr_Matrix[5])();
    poVar1 = std::operator<<((ostream *)&std::cout,"\nBias Vector: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bias);
    std::operator<<(poVar1,"\n\n");
    (*this->bias->_vptr_Matrix[5])();
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void NeuralLayer::print() const {
    std::cout << "\nData Vector: " << data << "\n\n";
    data -> print();
    if(bias) {
        std::cout << "\nWeight Matrix: " << weights << "\n\n";
        weights -> print();
        std::cout << "\nBias Vector: " << bias << "\n\n";
        bias -> print();
    }
    std::cout << std::endl;
}